

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setCurrency(DecimalFormat *this,char16_t *theCurrency,UErrorCode *ec)

{
  UBool UVar1;
  bool bVar2;
  DecimalFormatProperties *pDVar3;
  bool bVar4;
  CurrencyUnit local_78;
  undefined4 local_58;
  ConstChar16Ptr local_48;
  undefined1 local_40 [8];
  CurrencyUnit currencyUnit;
  UErrorCode *ec_local;
  char16_t *theCurrency_local;
  DecimalFormat *this_local;
  
  currencyUnit._24_8_ = ec;
  ConstChar16Ptr::ConstChar16Ptr(&local_48,theCurrency);
  CurrencyUnit::CurrencyUnit((CurrencyUnit *)local_40,&local_48,(UErrorCode *)currencyUnit._24_8_);
  ConstChar16Ptr::~ConstChar16Ptr(&local_48);
  UVar1 = ::U_FAILURE(*(UErrorCode *)currencyUnit._24_8_);
  if (UVar1 == '\0') {
    pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    bVar2 = icu_63::number::impl::NullableValue<icu_63::CurrencyUnit>::isNull(&pDVar3->currency);
    bVar4 = false;
    if (!bVar2) {
      pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      icu_63::number::impl::NullableValue<icu_63::CurrencyUnit>::getNoError
                (&local_78,&pDVar3->currency);
      UVar1 = MeasureUnit::operator==(&local_78.super_MeasureUnit,(UObject *)local_40);
      bVar4 = UVar1 != '\0';
      CurrencyUnit::~CurrencyUnit(&local_78);
    }
    if (bVar4) {
      local_58 = 1;
    }
    else {
      NumberFormat::setCurrency
                (&this->super_NumberFormat,theCurrency,(UErrorCode *)currencyUnit._24_8_);
      pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      icu_63::number::impl::NullableValue<icu_63::CurrencyUnit>::operator=
                (&pDVar3->currency,(CurrencyUnit *)local_40);
      touchNoError(this);
      local_58 = 0;
    }
  }
  else {
    local_58 = 1;
  }
  CurrencyUnit::~CurrencyUnit((CurrencyUnit *)local_40);
  return;
}

Assistant:

void DecimalFormat::setCurrency(const char16_t* theCurrency, UErrorCode& ec) {
    CurrencyUnit currencyUnit(theCurrency, ec);
    if (U_FAILURE(ec)) { return; }
    if (!fields->properties->currency.isNull() && fields->properties->currency.getNoError() == currencyUnit) {
        return;
    }
    NumberFormat::setCurrency(theCurrency, ec); // to set field for compatibility
    fields->properties->currency = currencyUnit;
    // TODO: Set values in fields->symbols, too?
    touchNoError();
}